

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_write_offset
          (filemgr *file,bid_t bid,uint64_t offset,uint64_t len,void *buf,bool final_write,
          err_log_callback *log_callback)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  void *bid_00;
  void *pvVar6;
  long lVar7;
  cs_off_t cVar8;
  void *pvVar9;
  size_t sVar10;
  size_t in_RCX;
  long in_RDX;
  ulong bid_01;
  ulong in_RSI;
  filemgr *in_RDI;
  void *in_R8;
  byte in_R9B;
  err_log_callback *in_stack_00000008;
  uint32_t crc32;
  uint8_t marker;
  void *_buf;
  bid_t cur_file_last_bid;
  int64_t cur_file_pos;
  bid_t is_writer;
  plock_entry_t *plock_entry;
  bool locked;
  char *msg_2;
  char *msg_1;
  char *msg;
  uint64_t curr_commit_pos;
  uint64_t pos;
  ssize_t r;
  size_t lock_no;
  char *in_stack_00000128;
  char *in_stack_00000130;
  fdb_status in_stack_0000013c;
  err_log_callback *in_stack_00000140;
  filemgr_ops *in_stack_00000148;
  superblock *in_stack_ffffffffffffff08;
  plock_entry_t *in_stack_ffffffffffffff10;
  plock *in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  filemgr *in_stack_ffffffffffffff28;
  fdb_status local_c8;
  fdb_status local_c4;
  fdb_status local_c0;
  fdb_status local_bc;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 final_write_00;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  filemgr *file_00;
  undefined7 in_stack_ffffffffffffffb8;
  
  final_write_00 = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  bVar2 = in_R9B & 1;
  file_00 = (filemgr *)0x0;
  bid_00 = (void *)(in_RSI * in_RDI->blocksize + in_RDX);
  pvVar6 = (void *)atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_ffffffffffffff10,
                                       (memory_order)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  if ((ulong)in_RDI->blocksize < in_RDX + in_RCX) {
    fdb_log_impl(in_stack_00000008,2,FDB_RESULT_WRITE_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_write_offset",0x8bc,
                 "Write error: trying to write the buffer data (offset: %lu, len: %lu that exceeds the block size %lu in a database file \'%s\'\n"
                 ,in_RDX,in_RCX,
                 CONCAT44((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_RDI->blocksize),
                 in_RDI->filename);
    return FDB_RESULT_WRITE_FAIL;
  }
  bVar3 = sb_bmp_exists(in_stack_ffffffffffffff08);
  if (bVar3) {
    bVar3 = (*sb_ops.is_writable)(in_RDI,in_RSI);
    if (!bVar3) {
      fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_write_offset",0x8c7,
                   "Write error: trying to write at the offset %lu that is not identified as a reusable block in a database file \'%s\'\n"
                   ,bid_00,in_RDI->filename);
      return FDB_RESULT_WRITE_FAIL;
    }
  }
  else if ((bid_00 < pvVar6) &&
          ((in_RDI->sb == (superblock *)0x0 ||
           ((in_RDI->sb != (superblock *)0x0 &&
            ((void *)(ulong)((uint)in_RDI->sb->config->num_sb * in_RDI->blocksize) <= bid_00)))))) {
    fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_write_offset",0x8d3,
                 "Write error: trying to write at the offset %lu that is smaller than the current commit offset %lu in a database file \'%s\'\n"
                 ,bid_00,pvVar6,in_RDI->filename);
    return FDB_RESULT_WRITE_FAIL;
  }
  if (global_config.ncacheblock < 1) {
    if ((in_RCX == in_RDI->blocksize) &&
       (*(char *)((long)in_R8 + ((ulong)in_RDI->blocksize - 1)) == -1)) {
      memset((void *)((long)in_R8 + 8),0xff,8);
      uVar5 = get_checksum((uint8_t *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
                           CRC_UNKNOWN);
      *(uint32_t *)((long)in_R8 + 8) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    sVar10 = (*in_RDI->ops->pwrite)(in_RDI->fd,in_R8,in_RCX,(cs_off_t)bid_00);
    _log_errno_str(in_stack_00000148,in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                   in_stack_00000128);
    if (sVar10 != in_RCX) {
      if ((long)sVar10 < 0) {
        local_c8 = (fdb_status)sVar10;
      }
      else {
        local_c8 = FDB_RESULT_WRITE_FAIL;
      }
      return local_c8;
    }
  }
  else {
    bid_01 = in_RSI % 0x29;
    plock_lock((plock *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    if (in_RCX == in_RDI->blocksize) {
      iVar4 = bcache_write((filemgr *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),bid_01,file_00,
                           (bcache_dirty_t)((ulong)bid_00 >> 0x20),SUB81((ulong)bid_00 >> 0x18,0),
                           SUB81((ulong)bid_00 >> 0x10,0));
      lVar7 = (long)iVar4;
      if (lVar7 != global_config.blocksize) {
        plock_unlock(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        _log_errno_str(in_stack_00000148,in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                       in_stack_00000128);
        if (lVar7 < 0) {
          local_bc = (fdb_status)lVar7;
        }
        else {
          local_bc = FDB_RESULT_WRITE_FAIL;
        }
        return local_bc;
      }
    }
    else {
      iVar4 = bcache_write_partial
                        (file_00,(bid_t)bid_00,pvVar6,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88,(bool)final_write_00);
      pvVar6 = (void *)(long)iVar4;
      if (pvVar6 == (void *)0x0) {
        cVar8 = (*in_RDI->ops->goto_eof)(in_RDI->fd);
        if (cVar8 < 0) {
          _log_errno_str(in_stack_00000148,in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                         in_stack_00000128);
          return (fdb_status)cVar8;
        }
        uVar1 = in_RDI->blocksize;
        pvVar9 = _filemgr_get_temp_buf();
        if ((in_RSI < (ulong)(cVar8 / (long)(ulong)uVar1)) &&
           (pvVar6 = (void *)filemgr_read_block(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                                (bid_t)in_stack_ffffffffffffff18),
           pvVar6 != (void *)(ulong)in_RDI->blocksize)) {
          plock_unlock(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          _filemgr_release_temp_buf(in_stack_ffffffffffffff10);
          _log_errno_str(in_stack_00000148,in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                         in_stack_00000128);
          if ((long)pvVar6 < 0) {
            local_c0 = (fdb_status)pvVar6;
          }
          else {
            local_c0 = FDB_RESULT_READ_FAIL;
          }
          return local_c0;
        }
        memcpy((void *)((long)pvVar9 + in_RDX),in_R8,in_RCX);
        iVar4 = bcache_write((filemgr *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),bid_01,pvVar6,
                             (bcache_dirty_t)((ulong)bid_00 >> 0x20),SUB81((ulong)bid_00 >> 0x18,0),
                             SUB81((ulong)bid_00 >> 0x10,0));
        lVar7 = (long)iVar4;
        if (lVar7 != global_config.blocksize) {
          plock_unlock(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          _filemgr_release_temp_buf(in_stack_ffffffffffffff10);
          _log_errno_str(in_stack_00000148,in_stack_00000140,in_stack_0000013c,in_stack_00000130,
                         in_stack_00000128);
          if (lVar7 < 0) {
            local_c4 = (fdb_status)lVar7;
          }
          else {
            local_c4 = FDB_RESULT_WRITE_FAIL;
          }
          return local_c4;
        }
        _filemgr_release_temp_buf(in_stack_ffffffffffffff10);
      }
    }
    plock_unlock(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status filemgr_write_offset(struct filemgr *file, bid_t bid,
                                uint64_t offset, uint64_t len, void *buf,
                                bool final_write,
                                err_log_callback *log_callback)
{
    size_t lock_no;
    ssize_t r = 0;
    uint64_t pos = bid * file->blocksize + offset;
    uint64_t curr_commit_pos = atomic_get_uint64_t(&file->last_commit);

    if (offset + len > file->blocksize) {
        const char *msg = "Write error: trying to write the buffer data "
            "(offset: %" _F64 ", len: %" _F64 " that exceeds the block size "
            "%" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_WRITE_FAIL,
                msg, offset, len,
                file->blocksize, file->filename);
        return FDB_RESULT_WRITE_FAIL;
    }

    if (sb_bmp_exists(file->sb)) {
        // block reusing is enabled
        if (!sb_ops.is_writable(file, bid)) {
            const char *msg = "Write error: trying to write at the offset %" _F64 " that is "
                              "not identified as a reusable block in "
                              "a database file '%s'\n";
            fdb_log(NULL, FDB_LOG_FATAL, FDB_RESULT_WRITE_FAIL,
                    msg, pos, file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }
    } else if (pos < curr_commit_pos) {
        // stale blocks are not reused yet
        if (file->sb == NULL ||
            (file->sb && pos >= file->sb->config->num_sb * file->blocksize)) {
            // (non-sequential update is exceptionally allowed for superblocks)
            const char *msg = "Write error: trying to write at the offset %" _F64 " that is "
                              "smaller than the current commit offset %" _F64 " in "
                              "a database file '%s'\n";
            fdb_log(NULL, FDB_LOG_FATAL, FDB_RESULT_WRITE_FAIL,
                    msg, pos, curr_commit_pos, file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        bool locked = false;
        plock_entry_t *plock_entry;
        bid_t is_writer = 1;
        plock_entry = plock_lock(&file->plock, &bid, &is_writer);
        locked = true;

        if (len == file->blocksize) {
            // write entire block .. we don't need to read previous block
            r = bcache_write(file, bid, buf, BCACHE_REQ_DIRTY, final_write, false);
            if (r != global_config.blocksize) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                _log_errno_str(file->ops, log_callback,
                               (fdb_status) r, "WRITE", file->filename);
                return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
            }
        } else {
            // partially write buffer cache first
            r = bcache_write_partial(file, bid, buf, offset, len, final_write);
            if (r == 0) {
                // cache miss
                // write partially .. we have to read previous contents of the block
                int64_t cur_file_pos = file->ops->goto_eof(file->fd);
                if (cur_file_pos < 0) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) cur_file_pos, "EOF", file->filename);
                    return (fdb_status) cur_file_pos;
                }
                bid_t cur_file_last_bid = cur_file_pos / file->blocksize;
                void *_buf = _filemgr_get_temp_buf();

                if (bid >= cur_file_last_bid) {
                    // this is the first time to write this block
                    // we don't need to read previous block from file.
                } else {
                    r = filemgr_read_block(file, _buf, bid);
                    if (r != (ssize_t)file->blocksize) {
                        if (locked) {
                            plock_unlock(&file->plock, plock_entry);
                        }
                        _filemgr_release_temp_buf(_buf);
                        _log_errno_str(file->ops, log_callback, (fdb_status) r,
                                       "READ", file->filename);
                        return r < 0 ? (fdb_status) r : FDB_RESULT_READ_FAIL;
                    }
                }
                memcpy((uint8_t *)_buf + offset, buf, len);
                r = bcache_write(file, bid, _buf, BCACHE_REQ_DIRTY, final_write, false);
                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _filemgr_release_temp_buf(_buf);
                    _log_errno_str(file->ops, log_callback,
                            (fdb_status) r, "WRITE", file->filename);
                    return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                }

                _filemgr_release_temp_buf(_buf);
            } // cache miss
        } // full block or partial block

        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else { // block cache disabled

        if (len == file->blocksize) {
            uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
            if (marker == BLK_MARKER_BNODE) {
                memset((uint8_t *)buf + BTREE_CRC_OFFSET, 0xff, BTREE_CRC_FIELD_LEN);
                uint32_t crc32 = get_checksum(reinterpret_cast<const uint8_t*>(buf),
                                              file->blocksize,
                                              file->crc_mode);
                crc32 = _endian_encode(crc32);
                memcpy((uint8_t *)buf + BTREE_CRC_OFFSET, &crc32, sizeof(crc32));
            }
        }

        r = file->ops->pwrite(file->fd, buf, len, pos);
        _log_errno_str(file->ops, log_callback, (fdb_status) r, "WRITE", file->filename);
        if ((uint64_t)r != len) {
            return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
        }
    } // block cache check
    return FDB_RESULT_SUCCESS;
}